

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::computeNameRef
          (CheckerVisitor *this,Expr *e,SQChar *b,int32_t *ptr,int32_t size)

{
  int iVar1;
  TreeOp size_00;
  int iVar2;
  Id *this_00;
  SQChar *pSVar3;
  int *in_RCX;
  GetFieldExpr *in_RDX;
  CheckerVisitor *in_RSI;
  int in_R8D;
  int32_t l;
  undefined4 in_stack_ffffffffffffffd8;
  
  size_00 = Node::op((Node *)in_RSI);
  if (size_00 == TO_ID) {
    iVar2 = *in_RCX;
    iVar1 = *in_RCX;
    this_00 = Node::asId((Node *)in_RSI);
    pSVar3 = Id::id(this_00);
    iVar2 = snprintf((char *)((long)&(in_RDX->super_FieldAccessExpr).super_AccessExpr.super_Expr.
                                     super_Node.super_ArenaObj._vptr_ArenaObj + (long)iVar2),
                     (long)(in_R8D - iVar1),"%s",pSVar3);
    *in_RCX = iVar2 + *in_RCX;
  }
  else if (size_00 == TO_BASE) {
    snprintf((char *)((long)&(in_RDX->super_FieldAccessExpr).super_AccessExpr.super_Expr.super_Node.
                             super_ArenaObj._vptr_ArenaObj + (long)*in_RCX),(long)(in_R8D - *in_RCX)
             ,"%s",&base_str);
    *in_RCX = *in_RCX + 5;
  }
  else if (size_00 == TO_ROOT_TABLE_ACCESS) {
    snprintf((char *)((long)&(in_RDX->super_FieldAccessExpr).super_AccessExpr.super_Expr.super_Node.
                             super_ArenaObj._vptr_ArenaObj + (long)*in_RCX),(long)(in_R8D - *in_RCX)
             ,"%s",&double_colon_str);
    *in_RCX = *in_RCX + 3;
  }
  else if (size_00 == TO_GETFIELD) {
    Node::asGetField((Node *)in_RSI);
    computeNameRef(in_RSI,in_RDX,(SQChar *)in_RCX,
                   (int32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),size_00);
  }
  return;
}

Assistant:

void CheckerVisitor::computeNameRef(const Expr *e, SQChar *b, int32_t &ptr, int32_t size) {
  switch (e->op())
  {
  case TO_GETFIELD: return computeNameRef(e->asGetField(), b, ptr, size);
  //case TO_GETSLOT: return computeNameRef(lhs->asGetSlot());
  case TO_ID: {
    int32_t l = snprintf(&b[ptr], size - ptr, "%s", e->asId()->id());
    ptr += l;
    break;
  }
  case TO_ROOT_TABLE_ACCESS:
    snprintf(&b[ptr], size - ptr, "%s", double_colon_str);
    ptr += sizeof double_colon_str;
    break;
  case TO_BASE:
    snprintf(&b[ptr], size - ptr, "%s", base_str);
    ptr += sizeof base_str;
    break;
  default:
    assert(0);
  }
}